

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

void board_printKlondikeSolverDeck(Board *board)

{
  code *pcVar1;
  uint uVar2;
  Spot *pSVar3;
  Board *in_RDI;
  bool bVar4;
  Spot *spot;
  int j;
  int i;
  int local_10;
  uint local_c;
  
  local_c = 0;
  do {
    if (6 < (int)local_c) {
      pSVar3 = board_spotGet(in_RDI,STOCK,'\0');
      local_c = (uint)pSVar3->cardsCount;
      if (SBORROW4(local_c,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      while( true ) {
        local_c = local_c - 1;
        if ((int)local_c < 0) {
          printf("\n");
          return;
        }
        uVar2 = (uint)pSVar3->cards[(int)local_c]->suit;
        if (SCARRY4(uVar2,1)) break;
        printf("%02d%d",(ulong)pSVar3->cards[(int)local_c]->rank,(ulong)(uVar2 + 1));
        if (SBORROW4(local_c,1)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_10 = 0;
    while (local_10 < 7) {
      pSVar3 = board_spotGet(in_RDI,TABLEAU,(uchar)local_10);
      if (SCARRY4(local_c,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      if ((int)(local_c + 1) <= (int)(uint)pSVar3->cardsCount) {
        uVar2 = (uint)pSVar3->cards[(int)local_c]->suit;
        if (SCARRY4(uVar2,1)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        printf("%02d%d",(ulong)pSVar3->cards[(int)local_c]->rank,(ulong)(uVar2 + 1));
      }
      bVar4 = SCARRY4(local_10,1);
      local_10 = local_10 + 1;
      if (bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    bVar4 = SCARRY4(local_c,1);
    local_c = local_c + 1;
    if (bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  } while( true );
}

Assistant:

void board_printKlondikeSolverDeck(Board * board)
{
	int i,j;
	Spot * spot;

	for(i=0;i<7;i++)
	{
		for(j=0;j<7;j++)
		{
			spot = board_spotGet(board, TABLEAU, j);
			if(spot->cardsCount>=(i+1))
				printf("%02d%d", spot->cards[i]->rank, spot->cards[i]->suit+1);
		}
	}

	spot = board_spotGet(board, STOCK, 0);
	for(i=spot->cardsCount-1;i>=0;i--)
	{
		printf("%02d%d", spot->cards[i]->rank, spot->cards[i]->suit+1);
	}

	printf("\n");
}